

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O0

BGParseManager * BGParseManager::GetBGParseManager(void)

{
  HeapAllocator *alloc;
  BGParseManager *pBVar1;
  JobProcessor *pJVar2;
  TrackAllocData local_50;
  AutoNestedHandledExceptionType local_14;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  AutoCriticalSection lock;
  
  AutoCriticalSection::AutoCriticalSection
            ((AutoCriticalSection *)&stack0xfffffffffffffff0,&s_staticMemberLock);
  if (s_BGParseManager == (BGParseManager *)0x0) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_14,ExceptionType_DisableCheck);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
               ,0x21);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
    pBVar1 = (BGParseManager *)new<Memory::HeapAllocator>(0x68,alloc,0x350bd0);
    BGParseManager(pBVar1);
    s_BGParseManager = pBVar1;
    pJVar2 = JsUtil::JobManager::Processor((JobManager *)pBVar1);
    (**pJVar2->_vptr_JobProcessor)(pJVar2,s_BGParseManager);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_14);
  }
  pBVar1 = s_BGParseManager;
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&stack0xfffffffffffffff0);
  return pBVar1;
}

Assistant:

BGParseManager* BGParseManager::GetBGParseManager()
{
    AutoCriticalSection lock(&s_staticMemberLock);
    if (s_BGParseManager == nullptr)
    {        
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
        s_BGParseManager = HeapNew(BGParseManager);
        s_BGParseManager->Processor()->AddManager(s_BGParseManager);
    }
    return s_BGParseManager;
}